

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sumInverse(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVar1;
  SumCtx *pSum;
  sqlite3_int64 sVar2;
  double dVar3;
  i64 iVal;
  int type;
  SumCtx *p;
  sqlite3_value **argv_local;
  int argc_local;
  sqlite3_context *context_local;
  
  pSum = (SumCtx *)sqlite3_aggregate_context(context,0x28);
  iVar1 = sqlite3_value_numeric_type(*argv);
  if ((pSum != (SumCtx *)0x0) && (iVar1 != 5)) {
    pSum->cnt = pSum->cnt + -1;
    if (pSum->approx == '\0') {
      sVar2 = sqlite3_value_int64(*argv);
      pSum->iSum = pSum->iSum - sVar2;
    }
    else if (iVar1 == 1) {
      sVar2 = sqlite3_value_int64(*argv);
      if (sVar2 == -0x8000000000000000) {
        kahanBabuskaNeumaierStepInt64(pSum,0x7fffffffffffffff);
        kahanBabuskaNeumaierStepInt64(pSum,1);
      }
      else {
        kahanBabuskaNeumaierStepInt64(pSum,-sVar2);
      }
    }
    else {
      dVar3 = sqlite3_value_double(*argv);
      kahanBabuskaNeumaierStep(pSum,-dVar3);
    }
  }
  return;
}

Assistant:

static void sumInverse(sqlite3_context *context, int argc, sqlite3_value**argv){
  SumCtx *p;
  int type;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  p = sqlite3_aggregate_context(context, sizeof(*p));
  type = sqlite3_value_numeric_type(argv[0]);
  /* p is always non-NULL because sumStep() will have been called first
  ** to initialize it */
  if( ALWAYS(p) && type!=SQLITE_NULL ){
    assert( p->cnt>0 );
    p->cnt--;
    if( !p->approx ){
      p->iSum -= sqlite3_value_int64(argv[0]);
    }else if( type==SQLITE_INTEGER ){
      i64 iVal = sqlite3_value_int64(argv[0]);
      if( iVal!=SMALLEST_INT64 ){
        kahanBabuskaNeumaierStepInt64(p, -iVal);
      }else{
        kahanBabuskaNeumaierStepInt64(p, LARGEST_INT64);
        kahanBabuskaNeumaierStepInt64(p, 1);
      }
    }else{
      kahanBabuskaNeumaierStep(p, -sqlite3_value_double(argv[0]));
    }
  }
}